

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

wasm_functype_t * wasm_func_type(wasm_func_t *func)

{
  wasm_functype_t *this;
  Func *pFVar1;
  FuncType local_50;
  
  fprintf(_stderr,"CAPI: [%s] \n","wasm_func_type");
  this = (wasm_functype_t *)operator_new(0x30);
  pFVar1 = wasm_ref_t::As<wabt::interp::Func>((wasm_ref_t *)func);
  wabt::interp::FuncType::FuncType(&local_50,&pFVar1->type_);
  wasm_functype_t::wasm_functype_t(this,&local_50);
  wabt::interp::FuncType::~FuncType(&local_50);
  return this;
}

Assistant:

own wasm_functype_t* wasm_func_type(const wasm_func_t* func) {
  TRACE0();
  return new wasm_functype_t{func->As<Func>()->type()};
}